

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

double __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_number
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  xpath_memory_block *pxVar1;
  bool bVar2;
  xpath_value_type xVar3;
  long lVar4;
  long lVar5;
  xpath_node *pxVar6;
  size_t sVar7;
  xpath_memory_block *pxVar8;
  xpath_allocator *pxVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double local_a8;
  double local_98;
  undefined1 local_80 [16];
  xpath_node *local_70;
  size_t local_60;
  xpath_memory_block *local_58;
  xpath_allocator *local_50;
  xpath_string local_48;
  undefined1 auVar13 [16];
  
LAB_0033c37a:
  switch(this->_type) {
  case '\t':
    dVar12 = eval_number(this->_left,c,stack);
    local_a8 = eval_number(this->_right,c,stack);
    local_a8 = local_a8 + dVar12;
    break;
  case '\n':
    dVar12 = eval_number(this->_left,c,stack);
    dVar11 = eval_number(this->_right,c,stack);
    return dVar12 - dVar11;
  case '\v':
    dVar12 = eval_number(this->_left,c,stack);
    dVar11 = eval_number(this->_right,c,stack);
    return dVar11 * dVar12;
  case '\f':
    dVar12 = eval_number(this->_left,c,stack);
    dVar11 = eval_number(this->_right,c,stack);
    return dVar12 / dVar11;
  case '\r':
    dVar12 = eval_number(this->_left,c,stack);
    dVar11 = eval_number(this->_right,c,stack);
    dVar12 = fmod(dVar12,dVar11);
    return dVar12;
  case '\x0e':
    dVar12 = eval_number(this->_left,c,stack);
    return -dVar12;
  default:
    xVar3 = (xpath_value_type)(byte)this->_rettype;
    goto LAB_0033c7a5;
  case '\x13':
    return (this->_data).number;
  case '\x14':
    xVar3 = (xpath_value_type)this->_rettype;
    if (((this->_data).variable)->_type != xVar3) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x29f3,
                    "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x02') {
      return *(double *)((this->_data).variable + 1);
    }
LAB_0033c7a5:
    if ((char)xVar3 == '\x01') {
      pxVar9 = stack->result;
      pxVar8 = pxVar9->_root;
      local_98 = (double)pxVar9->_root_size;
      eval_string((xpath_string *)local_80,this,c,stack);
      local_a8 = convert_string_to_number((char_t *)local_80._0_8_);
      pxVar1 = pxVar9->_root;
      while (pxVar1 != pxVar8) {
        pxVar1 = pxVar1->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
    }
    else {
      if ((xVar3 & 0xff) != xpath_type_string) {
        if ((xVar3 & 0xff) == xpath_type_boolean) {
          bVar2 = eval_boolean(this,c,stack);
          return (double)bVar2;
        }
        __assert_fail("false && \"Wrong expression for return type number\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x2a15,
                      "double pugi::impl::(anonymous namespace)::xpath_ast_node::eval_number(const xpath_context &, const xpath_stack &)"
                     );
      }
      pxVar9 = stack->result;
      pxVar8 = pxVar9->_root;
      local_98 = (double)pxVar9->_root_size;
      eval_string((xpath_string *)local_80,this,c,stack);
      local_a8 = convert_string_to_number((char_t *)local_80._0_8_);
      pxVar1 = pxVar9->_root;
      while (pxVar1 != pxVar8) {
        pxVar1 = pxVar1->next;
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
      }
    }
    pxVar9->_root = pxVar8;
    pxVar9->_root_size = (size_t)local_98;
    return local_a8;
  case '\x15':
    sVar7 = c->size;
    goto LAB_0033c70b;
  case '\x16':
    sVar7 = c->position;
LAB_0033c70b:
    auVar14._0_8_ = (double)CONCAT44(0x43300000,(int)sVar7);
    auVar14._8_4_ = (int)(sVar7 >> 0x20);
    auVar14._12_4_ = 0x45300000;
    return (auVar14._8_8_ - 1.9342813113834067e+25) + (auVar14._0_8_ - 4503599627370496.0);
  case '\x17':
    pxVar9 = stack->result;
    pxVar8 = pxVar9->_root;
    sVar7 = pxVar9->_root_size;
    eval_node_set((xpath_node_set_raw *)local_80,this->_left,c,stack,nodeset_eval_all);
    lVar4 = (long)local_70 - CONCAT71(local_80._9_7_,local_80[8]);
    lVar5 = lVar4 >> 4;
    auVar13._8_4_ = (int)(lVar4 >> 0x24);
    auVar13._0_8_ = lVar5;
    auVar13._12_4_ = 0x45300000;
    local_a8 = auVar13._8_8_;
    uVar10 = (undefined4)lVar5;
    pxVar1 = pxVar9->_root;
    while (pxVar1 != pxVar8) {
      pxVar1 = pxVar1->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    goto LAB_0033c882;
  case '(':
    pxVar9 = stack->result;
    pxVar8 = pxVar9->_root;
    sVar7 = pxVar9->_root_size;
    string_value((xpath_string *)local_80,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,pxVar9);
    if (local_80[8] != true) {
      local_70 = (xpath_node *)strlength((char_t *)local_80._0_8_);
    }
    auVar15._8_4_ = (int)((ulong)local_70 >> 0x20);
    auVar15._0_8_ = local_70;
    auVar15._12_4_ = 0x45300000;
    pxVar1 = pxVar9->_root;
    while (pxVar1 != pxVar8) {
      pxVar1 = pxVar1->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    local_a8 = (auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0);
    pxVar9->_root = pxVar8;
    pxVar9->_root_size = sVar7;
    break;
  case ')':
    pxVar9 = stack->result;
    pxVar8 = pxVar9->_root;
    sVar7 = pxVar9->_root_size;
    eval_string((xpath_string *)local_80,this->_left,c,stack);
    if (local_80[8] != true) {
      local_70 = (xpath_node *)strlength((char_t *)local_80._0_8_);
    }
    auVar16._8_4_ = (int)((ulong)local_70 >> 0x20);
    auVar16._0_8_ = local_70;
    auVar16._12_4_ = 0x45300000;
    local_a8 = auVar16._8_8_;
    uVar10 = SUB84(local_70,0);
    pxVar1 = pxVar9->_root;
    while (pxVar1 != pxVar8) {
      pxVar1 = pxVar1->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
LAB_0033c882:
    local_98 = (double)CONCAT44(0x43300000,uVar10) - 4503599627370496.0;
    local_a8 = local_a8 - 1.9342813113834067e+25;
    local_a8 = local_a8 + local_98;
    pxVar9->_root = pxVar8;
    pxVar9->_root_size = sVar7;
    break;
  case '2':
    pxVar9 = stack->result;
    pxVar8 = pxVar9->_root;
    sVar7 = pxVar9->_root_size;
    string_value((xpath_string *)local_80,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,pxVar9);
    local_a8 = convert_string_to_number((char_t *)local_80._0_8_);
    pxVar1 = pxVar9->_root;
    while (pxVar1 != pxVar8) {
      pxVar1 = pxVar1->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar9->_root = pxVar8;
    pxVar9->_root_size = sVar7;
    break;
  case '3':
    goto switchD_0033c391_caseD_33;
  case '4':
    local_50 = stack->result;
    local_58 = local_50->_root;
    local_60 = local_50->_root_size;
    eval_node_set((xpath_node_set_raw *)local_80,this->_left,c,stack,nodeset_eval_all);
    pxVar6 = (xpath_node *)CONCAT71(local_80._9_7_,local_80[8]);
    if (pxVar6 == local_70) {
      local_a8 = 0.0;
    }
    else {
      local_a8 = 0.0;
      do {
        pxVar9 = stack->result;
        pxVar8 = pxVar9->_root;
        sVar7 = pxVar9->_root_size;
        string_value(&local_48,(anon_unknown_0 *)(pxVar6->_node)._root,
                     (xpath_node *)(pxVar6->_attribute)._attr,pxVar9);
        dVar12 = convert_string_to_number(local_48._buffer);
        pxVar1 = pxVar9->_root;
        while (pxVar1 != pxVar8) {
          pxVar1 = pxVar1->next;
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    ();
        }
        local_a8 = local_a8 + dVar12;
        pxVar9->_root = pxVar8;
        pxVar9->_root_size = sVar7;
        pxVar6 = pxVar6 + 1;
      } while (pxVar6 != local_70);
    }
    pxVar9 = local_50;
    pxVar1 = local_58;
    pxVar8 = local_50->_root;
    while (pxVar8 != pxVar1) {
      pxVar8 = pxVar8->next;
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)();
    }
    pxVar9->_root = pxVar1;
    pxVar9->_root_size = local_60;
    break;
  case '5':
    local_a8 = eval_number(this->_left,c,stack);
    dVar12 = floor(local_a8);
    goto LAB_0033c782;
  case '6':
    local_a8 = eval_number(this->_left,c,stack);
    dVar12 = ceil(local_a8);
LAB_0033c782:
    return (double)(~-(ulong)(!NAN(local_a8) && !NAN(local_a8)) & (ulong)local_a8 |
                   (ulong)dVar12 & -(ulong)(!NAN(local_a8) && !NAN(local_a8)));
  case '7':
    dVar12 = eval_number(this->_left,c,stack);
    if ((-0.5 <= dVar12) && (dVar12 <= 0.0)) {
      dVar12 = ceil(dVar12);
      return dVar12;
    }
    dVar12 = floor(dVar12 + 0.5);
    return dVar12;
  }
  return local_a8;
switchD_0033c391_caseD_33:
  this = this->_left;
  goto LAB_0033c37a;
}

Assistant:

double eval_number(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_add:
				return _left->eval_number(c, stack) + _right->eval_number(c, stack);

			case ast_op_subtract:
				return _left->eval_number(c, stack) - _right->eval_number(c, stack);

			case ast_op_multiply:
				return _left->eval_number(c, stack) * _right->eval_number(c, stack);

			case ast_op_divide:
				return _left->eval_number(c, stack) / _right->eval_number(c, stack);

			case ast_op_mod:
				return fmod(_left->eval_number(c, stack), _right->eval_number(c, stack));

			case ast_op_negate:
				return -_left->eval_number(c, stack);

			case ast_number_constant:
				return _data.number;

			case ast_func_last:
				return static_cast<double>(c.size);

			case ast_func_position:
				return static_cast<double>(c.position);

			case ast_func_count:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_node_set(c, stack, nodeset_eval_all).size());
			}

			case ast_func_string_length_0:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(string_value(c.n, stack.result).length());
			}

			case ast_func_string_length_1:
			{
				xpath_allocator_capture cr(stack.result);

				return static_cast<double>(_left->eval_string(c, stack).length());
			}

			case ast_func_number_0:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(string_value(c.n, stack.result).c_str());
			}

			case ast_func_number_1:
				return _left->eval_number(c, stack);

			case ast_func_sum:
			{
				xpath_allocator_capture cr(stack.result);

				double r = 0;

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* it = ns.begin(); it != ns.end(); ++it)
				{
					xpath_allocator_capture cri(stack.result);

					r += convert_string_to_number(string_value(*it, stack.result).c_str());
				}

				return r;
			}

			case ast_func_floor:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? floor(r) : r;
			}

			case ast_func_ceiling:
			{
				double r = _left->eval_number(c, stack);

				return r == r ? ceil(r) : r;
			}

			case ast_func_round:
				return round_nearest_nzero(_left->eval_number(c, stack));

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_number)
					return _data.variable->get_number();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return eval_boolean(c, stack) ? 1 : 0;

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(eval_string(c, stack).c_str());
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return convert_string_to_number(eval_string(c, stack).c_str());
			}

			default:
				assert(false && "Wrong expression for return type number"); // unreachable
				return 0;
			}
		}